

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_constant_expression.cpp
# Opt level: O2

bool constant_referenced(ir_dereference *deref,hash_table *variable_context,ir_constant **store,
                        int *offset)

{
  ir_node_type iVar1;
  exec_node *peVar2;
  glsl_type *pgVar3;
  ir_dereference *piVar4;
  bool bVar5;
  uint uVar6;
  ir_constant *piVar7;
  hash_entry *phVar8;
  ir_dereference_variable *dv;
  int suboffset;
  ir_constant *substore;
  int local_34;
  ir_constant *local_30;
  
  *store = (ir_constant *)0x0;
  *offset = 0;
  if (variable_context == (hash_table *)0x0) {
    return false;
  }
  iVar1 = (deref->super_ir_rvalue).super_ir_instruction.ir_type;
  if (iVar1 == ir_type_dereference_variable) {
    phVar8 = _mesa_hash_table_search
                       (variable_context,
                        deref[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction);
    if (phVar8 == (hash_entry *)0x0) goto LAB_001d5dcf;
    piVar7 = (ir_constant *)phVar8->data;
  }
  else {
    if (iVar1 != ir_type_dereference_record) {
      if (iVar1 != ir_type_dereference_array) {
        __assert_fail("!\"Should not get here.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir_constant_expression.cpp"
                      ,0x231,
                      "bool constant_referenced(const ir_dereference *, struct hash_table *, ir_constant *&, int &)"
                     );
      }
      peVar2 = deref[1].super_ir_rvalue.super_ir_instruction.super_exec_node.next;
      piVar7 = (ir_constant *)(*(code *)peVar2->next[3].next)(peVar2,variable_context,0);
      if ((piVar7 != (ir_constant *)0x0) &&
         (pgVar3 = (piVar7->super_ir_rvalue).type, uVar6 = *(uint *)&pgVar3->field_0x4,
         (uVar6 & 0xfe) == 0 && pgVar3->vector_elements == '\x01')) {
        if ((uVar6 & 1) == 0) {
          uVar6 = ir_constant::get_uint_component(piVar7,0);
        }
        else {
          uVar6 = ir_constant::get_int_component(piVar7,0);
        }
        piVar4 = (ir_dereference *)
                 deref[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction;
        if (((piVar4 != (ir_dereference *)0x0) &&
            ((piVar4->super_ir_rvalue).super_ir_instruction.ir_type < ir_type_constant)) &&
           (bVar5 = constant_referenced(piVar4,variable_context,&local_30,&local_34), bVar5)) {
          pgVar3 = (glsl_type *)
                   deref[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction[4];
          if ((byte)pgVar3->field_0x4 == 0x11) {
            piVar7 = ir_constant::get_array_element(local_30,uVar6);
            *store = piVar7;
            local_34 = 0;
          }
          else if ((byte)pgVar3->field_0x4 - 2 < 3 && 1 < pgVar3->matrix_columns) {
            *store = local_30;
            local_34 = uVar6 * pgVar3->vector_elements;
          }
          else {
            bVar5 = glsl_type::is_vector(pgVar3);
            if (!bVar5) goto LAB_001d5dcf;
            *store = local_30;
            local_34 = uVar6 + local_34;
          }
          *offset = local_34;
        }
      }
      goto LAB_001d5dcf;
    }
    piVar4 = (ir_dereference *)deref[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction;
    if (((piVar4 == (ir_dereference *)0x0) ||
        (ir_type_dereference_variable < (piVar4->super_ir_rvalue).super_ir_instruction.ir_type)) ||
       (bVar5 = constant_referenced(piVar4,variable_context,&local_30,&local_34), !bVar5))
    goto LAB_001d5dcf;
    if (local_34 != 0) {
      __assert_fail("suboffset == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir_constant_expression.cpp"
                    ,0x220,
                    "bool constant_referenced(const ir_dereference *, struct hash_table *, ir_constant *&, int &)"
                   );
    }
    piVar7 = ir_constant::get_record_field
                       (local_30,*(int *)&deref[1].super_ir_rvalue.super_ir_instruction.
                                          super_exec_node.next);
  }
  *store = piVar7;
LAB_001d5dcf:
  return *store != (ir_constant *)0x0;
}

Assistant:

static bool
constant_referenced(const ir_dereference *deref,
                    struct hash_table *variable_context,
                    ir_constant *&store, int &offset)
{
   store = NULL;
   offset = 0;

   if (variable_context == NULL)
      return false;

   switch (deref->ir_type) {
   case ir_type_dereference_array: {
      const ir_dereference_array *const da =
         (const ir_dereference_array *) deref;

      ir_constant *const index_c =
         da->array_index->constant_expression_value(variable_context);

      if (!index_c || !index_c->type->is_scalar() ||
          !index_c->type->is_integer_32())
         break;

      const int index = index_c->type->base_type == GLSL_TYPE_INT ?
         index_c->get_int_component(0) :
         index_c->get_uint_component(0);

      ir_constant *substore;
      int suboffset;

      const ir_dereference *const deref = da->array->as_dereference();
      if (!deref)
         break;

      if (!constant_referenced(deref, variable_context, substore, suboffset))
         break;

      const glsl_type *const vt = da->array->type;
      if (vt->is_array()) {
         store = substore->get_array_element(index);
         offset = 0;
      } else if (vt->is_matrix()) {
         store = substore;
         offset = index * vt->vector_elements;
      } else if (vt->is_vector()) {
         store = substore;
         offset = suboffset + index;
      }

      break;
   }

   case ir_type_dereference_record: {
      const ir_dereference_record *const dr =
         (const ir_dereference_record *) deref;

      const ir_dereference *const deref = dr->record->as_dereference();
      if (!deref)
         break;

      ir_constant *substore;
      int suboffset;

      if (!constant_referenced(deref, variable_context, substore, suboffset))
         break;

      /* Since we're dropping it on the floor...
       */
      assert(suboffset == 0);

      store = substore->get_record_field(dr->field_idx);
      break;
   }

   case ir_type_dereference_variable: {
      const ir_dereference_variable *const dv =
         (const ir_dereference_variable *) deref;

      hash_entry *entry = _mesa_hash_table_search(variable_context, dv->var);
      if (entry)
         store = (ir_constant *) entry->data;
      break;
   }

   default:
      assert(!"Should not get here.");
      break;
   }

   return store != NULL;
}